

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_file_handle_free(fdb_file_handle *fhandle)

{
  void *in_RDI;
  
  free(*(void **)((long)in_RDI + 8));
  _free_cmp_func_list(fhandle);
  pthread_spin_destroy((pthread_spinlock_t *)((long)in_RDI + 0x20));
  free(in_RDI);
  return;
}

Assistant:

void fdb_file_handle_free(fdb_file_handle *fhandle)
{
    free(fhandle->handles);
    _free_cmp_func_list(fhandle);
    spin_destroy(&fhandle->lock);
    free(fhandle);
}